

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

void duckdb::ListSortFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector VVar1;
  VectorBuffer VVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  byte bVar5;
  Vector *vector;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  uint uVar9;
  reference pvVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  ulong uVar14;
  SelectionVector *pSVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  VectorBuffer *pVVar17;
  reference this;
  pointer pSVar18;
  type pSVar19;
  vector *pvVar20;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar21;
  Vector *pVVar22;
  long lVar23;
  idx_t offset_lists_indices;
  UnifiedVectorFormat *pUVar24;
  long *plVar25;
  idx_t child_idx;
  Value *pVVar26;
  bool data_to_sort;
  Vector *local_6d0;
  UnifiedVectorFormat *local_6c8;
  uint local_6bc;
  pointer local_6b8;
  DataChunk *local_6b0;
  SelectionVector *local_6a8;
  ulong local_6a0;
  void *local_698;
  pointer local_690;
  pointer local_688;
  void *local_680;
  void *local_678;
  RowDataCollectionScanner *local_670;
  Vector *local_668;
  SelectionVector sel_sorted;
  SelectionVector sel;
  LogicalType local_630 [24];
  LogicalType local_618 [24];
  LogicalType local_600 [24];
  DataChunk result_chunk;
  Vector result_vector;
  undefined8 uStack_5a0;
  UnifiedVectorFormat lists_data;
  void *local_530;
  long local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4f8;
  Vector sort_result_vec;
  LogicalType local_4e8 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_490;
  Vector payload_vector;
  LogicalType local_480 [24];
  long local_468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_450;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_428;
  Vector lists_indices;
  LogicalType local_418 [24];
  long local_400;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  LocalSortState local_sort_state;
  GlobalSortState global_sort_state;
  undefined8 uStack_2e0;
  SortLayout local_2b0 [400];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_120 [2];
  void *local_f0;
  vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
  local_c8 [24];
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  local_b0 [24];
  SortedBlock *local_98;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  local_90 [24];
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_78 [72];
  
  local_6c8 = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::SetVectorType((VectorType)result);
  FlatVector::VerifyFlatVector(result);
  local_6d0 = result;
  if (pvVar10[8] == (value_type)0x1) {
    _Var16._M_head_impl = *(unsigned_long **)(result + 0x28);
    if (_Var16._M_head_impl == (unsigned_long *)0x0) {
      _local_sort_state = *(undefined8 *)(result + 0x40);
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&global_sort_state,(unsigned_long *)&local_sort_state);
      uVar7 = _global_sort_state;
      _global_sort_state = 0;
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(undefined8 *)(result + 0x30) = uVar7;
      *(undefined8 *)(result + 0x38) = uStack_2e0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      _Var16._M_head_impl =
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      *(unsigned_long **)(local_6d0 + 0x28) = _Var16._M_head_impl;
    }
    *(byte *)_Var16._M_head_impl = (byte)*_Var16._M_head_impl & 0xfe;
  }
  else {
    pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8))
    ;
    pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                          *)(pBVar12 + 0x198));
    duckdb::BufferManager::GetBufferManager(*(ClientContext **)(pFVar13 + 0x78));
    local_6b8 = pFVar13;
    duckdb::GlobalSortState::GlobalSortState
              (&global_sort_state,*(ClientContext **)(pFVar13 + 0x78),pFVar13 + 0xd8,
               (RowLayout *)(pFVar13 + 0x80));
    duckdb::LocalSortState::LocalSortState(&local_sort_state);
    duckdb::LocalSortState::Initialize
              ((GlobalSortState *)&local_sort_state,(BufferManager *)&global_sort_state);
    if (local_6b8[0x40] == (FunctionData)0x1) {
      duckdb::LogicalType::LogicalType(local_600,(LogicalType *)(pvVar10 + 8));
      duckdb::Vector::Vector(&sort_result_vec,local_600,0x800);
      duckdb::LogicalType::~LogicalType(local_600);
    }
    else {
      duckdb::Vector::Vector(&sort_result_vec,local_6d0);
    }
    duckdb::VectorOperations::Copy(pvVar10,&sort_result_vec,(ulong)local_6c8,0,0);
    uVar14 = duckdb::ListVector::GetListSize(&sort_result_vec);
    pSVar15 = (SelectionVector *)duckdb::ListVector::GetEntry(&sort_result_vec);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
    duckdb::Vector::ToUnifiedFormat((ulong)&sort_result_vec,local_6c8);
    local_698 = local_530;
    duckdb::LogicalType::LogicalType(local_618,USMALLINT);
    duckdb::Vector::Vector(&lists_indices,local_618,0x800);
    duckdb::LogicalType::~LogicalType(local_618);
    duckdb::LogicalType::LogicalType(local_630,UINTEGER);
    local_6a0 = uVar14;
    duckdb::Vector::Vector(&payload_vector,local_630,0x800);
    duckdb::LogicalType::~LogicalType(local_630);
    SelectionVector::SelectionVector(&sel,0x800);
    data_to_sort = false;
    local_6b0 = args;
    local_6a8 = pSVar15;
    if (local_6c8 == (UnifiedVectorFormat *)0x0) {
      uVar14 = local_6a0;
      uVar9 = 0;
    }
    else {
      local_668 = local_6d0 + 0x30;
      local_688 = local_6b8 + 0x48;
      local_690 = local_6b8 + 0x60;
      offset_lists_indices = 0;
      local_6bc = 0;
      pUVar21 = (UnifiedVectorFormat *)0x0;
      do {
        uVar7 = uStack_5a0;
        pVVar22 = local_6d0;
        pUVar24 = pUVar21;
        if (*_lists_data != 0) {
          pUVar24 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_lists_data + (long)pUVar21 * 4);
        }
        if ((local_528 == 0) ||
           ((*(ulong *)(local_528 + ((ulong)pUVar24 >> 6) * 8) >> ((ulong)pUVar24 & 0x3f) & 1) != 0)
           ) {
          plVar25 = (long *)((long)pUVar24 * 0x10 + (long)local_698);
          if (plVar25[1] != 0) {
            uVar14 = 0;
            do {
              if (offset_lists_indices == 0x800) {
                SinkDataChunk((Vector *)local_6a8,&sel,0x800,
                              (vector<duckdb::LogicalType,_true> *)local_688,
                              (vector<duckdb::LogicalType,_true> *)local_690,&payload_vector,
                              &local_sort_state,&data_to_sort,&lists_indices);
                offset_lists_indices = 0;
              }
              lVar4 = *plVar25;
              sel.sel_vector[offset_lists_indices] = (sel_t)(lVar4 + uVar14);
              *(short *)(local_400 + offset_lists_indices * 2) = (short)pUVar21;
              uVar9 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(lVar4 + uVar14);
              *(uint *)(local_468 + offset_lists_indices * 4) = uVar9;
              offset_lists_indices = offset_lists_indices + 1;
              uVar14 = uVar14 + 1;
            } while (uVar14 < (ulong)plVar25[1]);
            local_6bc = local_6bc + (int)uVar14;
          }
        }
        else {
          _Var16._M_head_impl = *(unsigned_long **)(local_6d0 + 0x28);
          if (_Var16._M_head_impl == (unsigned_long *)0x0) {
            _result_chunk = *(undefined8 *)(local_6d0 + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&result_vector,(unsigned_long *)&result_chunk);
            uVar6 = _result_vector;
            _result_vector = 0;
            uStack_5a0 = 0;
            p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pVVar22 + 0x38);
            *(undefined8 *)(pVVar22 + 0x30) = uVar6;
            *(undefined8 *)(pVVar22 + 0x38) = uVar7;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 local_668);
            _Var16._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(local_6d0 + 0x28) = _Var16._M_head_impl;
          }
          bVar5 = (byte)pUVar21 & 0x3f;
          _Var16._M_head_impl[(ulong)pUVar21 >> 6] =
               _Var16._M_head_impl[(ulong)pUVar21 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        uVar14 = local_6a0;
        pUVar21 = pUVar21 + 1;
      } while (pUVar21 != local_6c8);
      uVar9 = local_6bc;
      if (offset_lists_indices != 0) {
        SinkDataChunk((Vector *)local_6a8,&sel,offset_lists_indices,
                      (vector<duckdb::LogicalType,_true> *)local_688,
                      (vector<duckdb::LogicalType,_true> *)local_690,&payload_vector,
                      &local_sort_state,&data_to_sort,&lists_indices);
        uVar9 = local_6bc;
      }
    }
    if (local_6b8[0x40] == (FunctionData)0x1) {
      duckdb::ListVector::Reserve(local_6d0,uVar14);
      duckdb::ListVector::SetListSize(local_6d0,uVar14);
      VVar1 = *local_6d0;
      pVVar22 = local_6d0;
      while (VVar1 == (Vector)0x3) {
        DictionaryVector::VerifyDictionary(pVVar22);
        pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                            ((shared_ptr<duckdb::VectorBuffer,_true> *)(pVVar22 + 0x58));
        pVVar22 = (Vector *)(pVVar17 + 0x30);
        VVar1 = *(Vector *)(pVVar17 + 0x30);
      }
      memcpy(*(void **)(pVVar22 + 0x20),local_698,(long)local_6c8 << 4);
    }
    if (data_to_sort == true) {
      duckdb::GlobalSortState::AddLocalState((LocalSortState *)&global_sort_state);
      duckdb::GlobalSortState::PrepareMergePhase();
      SelectionVector::SelectionVector(&sel_sorted,(ulong)uVar9);
      this = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](local_c8,0);
      pSVar18 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                operator->(this);
      pSVar19 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                operator*((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                           *)(pSVar18 + 0x20));
      duckdb::PayloadScanner::PayloadScanner
                ((PayloadScanner *)&local_680,pSVar19,&global_sort_state,true);
      pFVar13 = local_6b8 + 0x60;
      duckdb::DataChunk::DataChunk(&result_chunk);
      pvVar20 = (vector *)duckdb::Allocator::DefaultAllocator();
      duckdb::DataChunk::Initialize((Allocator *)&result_chunk,pvVar20,(ulong)pFVar13);
      duckdb::PayloadScanner::Scan((DataChunk *)&local_680);
      duckdb::DataChunk::~DataChunk(&result_chunk);
      pSVar15 = local_6a8;
      pVVar22 = local_6d0;
      if (local_6b8[0x40] == (FunctionData)0x1) {
        uVar14 = duckdb::ListVector::GetEntry(local_6d0);
        VVar2 = *(VectorBuffer *)pVVar22;
        vector = local_6d0;
        while (VVar2 == (VectorBuffer)0x3) {
          DictionaryVector::VerifyDictionary(vector);
          pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                              ((shared_ptr<duckdb::VectorBuffer,_true> *)(vector + 0x58));
          pVVar22 = (Vector *)(pVVar17 + 0x30);
          vector = pVVar22;
          VVar2 = pVVar17[0x30];
        }
        if (local_6c8 != (UnifiedVectorFormat *)0x0) {
          lVar4 = *(long *)(pVVar22 + 0x20);
          pUVar21 = (UnifiedVectorFormat *)0x0;
          do {
            if ((*(long *)(local_6d0 + 0x28) == 0) ||
               ((*(ulong *)(*(long *)(local_6d0 + 0x28) + ((ulong)pUVar21 >> 6) * 8) >>
                 ((ulong)pUVar21 & 0x3f) & 1) != 0)) {
              lVar23 = (long)pUVar21 * 0x10;
              pVVar26 = *(Value **)(lVar4 + lVar23);
              if (pVVar26 < pVVar26 + *(long *)(lVar4 + 8 + lVar23)) {
                do {
                  duckdb::Value::BIGINT((long)&result_vector);
                  duckdb::Vector::SetValue(uVar14,pVVar26);
                  duckdb::Value::~Value((Value *)&result_vector);
                  pVVar26 = pVVar26 + 1;
                } while (pVVar26 < (Value *)(((long *)(lVar23 + lVar4))[1] +
                                            *(long *)(lVar23 + lVar4)));
              }
            }
            pUVar21 = pUVar21 + 1;
          } while (pUVar21 != local_6c8);
        }
      }
      else {
        duckdb::Vector::Slice(local_6a8,(ulong)&sel_sorted);
        duckdb::Vector::Flatten((ulong)pSVar15);
      }
      if (local_670 != (RowDataCollectionScanner *)0x0) {
        RowDataCollectionScanner::~RowDataCollectionScanner(local_670);
        operator_delete(local_670);
      }
      local_670 = (RowDataCollectionScanner *)0x0;
      if (local_678 != (void *)0x0) {
        std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                  ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                   ((long)local_678 + 0x38));
        std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   *)((long)local_678 + 0x20));
        operator_delete(local_678);
      }
      local_678 = (void *)0x0;
      if (local_680 != (void *)0x0) {
        std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                  ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                   ((long)local_680 + 0x38));
        std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   *)((long)local_680 + 0x20));
        operator_delete(local_680);
      }
      if (sel_sorted.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sel_sorted.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    cVar8 = duckdb::DataChunk::AllConstant();
    if (cVar8 != '\0') {
      duckdb::Vector::SetVectorType((VectorType)local_6d0);
    }
    if (sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_428 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_428);
    }
    if (local_438 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438);
    }
    if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450);
    }
    duckdb::LogicalType::~LogicalType(local_480);
    if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0);
    }
    if (local_3d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0);
    }
    if (local_3e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8);
    }
    duckdb::LogicalType::~LogicalType(local_418);
    if (local_4f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f8);
    }
    if (local_518 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_518);
    }
    if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
    }
    if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0);
    }
    if (local_4b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b8);
    }
    duckdb::LogicalType::~LogicalType(local_4e8);
    LocalSortState::~LocalSortState(&local_sort_state);
    std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(local_78);
    std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector(local_90);
    if (local_98 != (SortedBlock *)0x0) {
      std::default_delete<duckdb::SortedBlock>::operator()
                ((default_delete<duckdb::SortedBlock> *)&local_98,local_98);
    }
    local_98 = (SortedBlock *)0x0;
    std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
    ::~vector(local_b0);
    std::
    vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
               *)local_c8);
    if (local_f0 != (void *)0x0) {
      operator_delete(local_f0);
    }
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_120);
    SortLayout::~SortLayout(local_2b0);
  }
  return;
}

Assistant:

static void ListSortFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1 && args.ColumnCount() <= 3);
	auto count = args.size();
	Vector &input_lists = args.data[0];

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &result_validity = FlatVector::Validity(result);

	if (input_lists.GetType().id() == LogicalTypeId::SQLNULL) {
		result_validity.SetInvalid(0);
		return;
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSortBindData>();

	// initialize the global and local sorting state
	auto &buffer_manager = BufferManager::GetBufferManager(info.context);
	GlobalSortState global_sort_state(info.context, info.orders, info.payload_layout);
	LocalSortState local_sort_state;
	local_sort_state.Initialize(global_sort_state, buffer_manager);

	Vector sort_result_vec = info.is_grade_up ? Vector(input_lists.GetType()) : result;

	// this ensures that we do not change the order of the entries in the input chunk
	VectorOperations::Copy(input_lists, sort_result_vec, count, 0, 0);

	// get the child vector
	auto lists_size = ListVector::GetListSize(sort_result_vec);
	auto &child_vector = ListVector::GetEntry(sort_result_vec);

	// get the lists data
	UnifiedVectorFormat lists_data;
	sort_result_vec.ToUnifiedFormat(count, lists_data);
	auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(lists_data);

	// create the lists_indices vector, this contains an element for each list's entry,
	// the element corresponds to the list's index, e.g. for [1, 2, 4], [5, 4]
	// lists_indices contains [0, 0, 0, 1, 1]
	Vector lists_indices(LogicalType::USMALLINT);
	auto lists_indices_data = FlatVector::GetData<uint16_t>(lists_indices);

	// create the payload_vector, this is just a vector containing incrementing integers
	// this will later be used as the 'new' selection vector of the child_vector, after
	// rearranging the payload according to the sorting order
	Vector payload_vector(LogicalType::UINTEGER);
	auto payload_vector_data = FlatVector::GetData<uint32_t>(payload_vector);

	// selection vector pointing to the data of the child vector,
	// used for slicing the child_vector correctly
	SelectionVector sel(STANDARD_VECTOR_SIZE);

	idx_t offset_lists_indices = 0;
	uint32_t incr_payload_count = 0;
	bool data_to_sort = false;

	for (idx_t i = 0; i < count; i++) {
		auto lists_index = lists_data.sel->get_index(i);
		const auto &list_entry = list_entries[lists_index];

		// nothing to do for this list
		if (!lists_data.validity.RowIsValid(lists_index)) {
			result_validity.SetInvalid(i);
			continue;
		}

		// empty list, no sorting required
		if (list_entry.length == 0) {
			continue;
		}

		for (idx_t child_idx = 0; child_idx < list_entry.length; child_idx++) {
			// lists_indices vector is full, sink
			if (offset_lists_indices == STANDARD_VECTOR_SIZE) {
				SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
				              local_sort_state, data_to_sort, lists_indices);
				offset_lists_indices = 0;
			}

			auto source_idx = list_entry.offset + child_idx;
			sel.set_index(offset_lists_indices, source_idx);
			lists_indices_data[offset_lists_indices] = UnsafeNumericCast<uint16_t>(i);
			payload_vector_data[offset_lists_indices] = NumericCast<uint32_t>(source_idx);
			offset_lists_indices++;
			incr_payload_count++;
		}
	}

	if (offset_lists_indices != 0) {
		SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
		              local_sort_state, data_to_sort, lists_indices);
	}

	if (info.is_grade_up) {
		ListVector::Reserve(result, lists_size);
		ListVector::SetListSize(result, lists_size);
		auto result_data = ListVector::GetData(result);
		memcpy(result_data, list_entries, count * sizeof(list_entry_t));
	}

	if (data_to_sort) {
		// add local state to global state, which sorts the data
		global_sort_state.AddLocalState(local_sort_state);
		global_sort_state.PrepareMergePhase();

		// selection vector that is to be filled with the 'sorted' payload
		SelectionVector sel_sorted(incr_payload_count);
		idx_t sel_sorted_idx = 0;

		// scan the sorted row data
		PayloadScanner scanner(*global_sort_state.sorted_blocks[0]->payload_data, global_sort_state);
		for (;;) {
			DataChunk result_chunk;
			result_chunk.Initialize(Allocator::DefaultAllocator(), info.payload_types);
			result_chunk.SetCardinality(0);
			scanner.Scan(result_chunk);
			if (result_chunk.size() == 0) {
				break;
			}

			// construct the selection vector with the new order from the result vectors
			Vector result_vector(result_chunk.data[0]);
			auto result_data = FlatVector::GetData<uint32_t>(result_vector);
			auto row_count = result_chunk.size();

			for (idx_t i = 0; i < row_count; i++) {
				sel_sorted.set_index(sel_sorted_idx, result_data[i]);
				D_ASSERT(result_data[i] < lists_size);
				sel_sorted_idx++;
			}
		}

		D_ASSERT(sel_sorted_idx == incr_payload_count);
		if (info.is_grade_up) {
			auto &result_entry = ListVector::GetEntry(result);
			auto result_data = ListVector::GetData(result);
			for (idx_t i = 0; i < count; i++) {
				if (!result_validity.RowIsValid(i)) {
					continue;
				}
				for (idx_t j = result_data[i].offset; j < result_data[i].offset + result_data[i].length; j++) {
					auto b = sel_sorted.get_index(j) - result_data[i].offset;
					result_entry.SetValue(j, Value::BIGINT(UnsafeNumericCast<int64_t>(b + 1)));
				}
			}
		} else {
			child_vector.Slice(sel_sorted, sel_sorted_idx);
			child_vector.Flatten(sel_sorted_idx);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}